

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

bool __thiscall SCCLiveness::FoldIndir(SCCLiveness *this,Instr *instr,Opnd *opnd)

{
  byte bVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  int32 left;
  undefined8 in_RAX;
  undefined4 *puVar6;
  void *pvVar7;
  long lVar8;
  MemRefOpnd *newDst;
  RegOpnd *index;
  undefined8 uStack_28;
  int32 offset;
  
  uStack_28 = in_RAX;
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  lVar8 = *(long *)&opnd[1].m_valueType;
  if (lVar8 != 0) {
    if (*(StackSym **)(lVar8 + 0x10) == (StackSym *)0x0) {
      return false;
    }
    bVar5 = StackSym::IsIntConst(*(StackSym **)(lVar8 + 0x10));
    if (!bVar5) {
      return false;
    }
    left = StackSym::GetIntConstValue(*(StackSym **)(lVar8 + 0x10));
    uStack_28 = CONCAT44(left,(undefined4)uStack_28);
    bVar1 = *(byte *)((long)&opnd[2]._vptr_Opnd + 4);
    if (bVar1 != 0) {
      bVar5 = Int32Math::Shl(left,(uint)bVar1,(int32 *)((long)&uStack_28 + 4));
      if (bVar5) {
        return false;
      }
      left = uStack_28._4_4_;
    }
    if (*(int32 *)&opnd[2]._vptr_Opnd != 0) {
      bVar5 = Int32Math::Add(*(int32 *)&opnd[2]._vptr_Opnd,left,(int32 *)((long)&uStack_28 + 4));
      if (bVar5) {
        return false;
      }
      left = uStack_28._4_4_;
    }
    *(int32 *)&opnd[2]._vptr_Opnd = left;
    opnd->field_0xe = 0;
    IR::IndirOpnd::SetIndexOpnd((IndirOpnd *)opnd,(RegOpnd *)0x0);
  }
  pp_Var2 = opnd[1]._vptr_Opnd;
  if (pp_Var2 == (_func_int **)0x0) {
    pvVar7 = (void *)(long)*(int *)&opnd[2]._vptr_Opnd;
LAB_00621e38:
    newDst = IR::MemRefOpnd::New(pvVar7,opnd->m_type,instr->m_func,AddrOpndKindDynamicMisc);
    if (instr->m_dst == opnd) {
      IR::Instr::ReplaceDst(instr,&newDst->super_Opnd);
    }
    else {
      IR::Instr::ReplaceSrc(instr,opnd,&newDst->super_Opnd);
    }
    return true;
  }
  if (((((StackSym *)pp_Var2[2] != (StackSym *)0x0) &&
       (bVar5 = StackSym::IsConst((StackSym *)pp_Var2[2]), bVar5)) &&
      (bVar5 = StackSym::IsIntConst((StackSym *)pp_Var2[2]), !bVar5)) &&
     (bVar5 = StackSym::IsFloatConst((StackSym *)pp_Var2[2]), !bVar5)) {
    pvVar7 = StackSym::GetConstAddress((StackSym *)pp_Var2[2],false);
    lVar8 = (long)*(int *)&opnd[2]._vptr_Opnd;
    if (lVar8 < 0) {
      if (pvVar7 < (void *)(lVar8 + (long)pvVar7)) {
        return false;
      }
    }
    else if ((void *)(lVar8 + (long)pvVar7) < pvVar7) {
      return false;
    }
    pvVar7 = (void *)((long)pvVar7 + lVar8);
    if ((void *)(long)(int)pvVar7 == pvVar7) goto LAB_00621e38;
  }
  return false;
}

Assistant:

bool
SCCLiveness::FoldIndir(IR::Instr *instr, IR::Opnd *opnd)
{
#ifdef _M_ARM32_OR_ARM64
    // Can't be folded on ARM or ARM64
    return false;
#else
    IR::IndirOpnd *indir = opnd->AsIndirOpnd();

    if(indir->GetIndexOpnd())
    {
        IR::RegOpnd *index = indir->GetIndexOpnd();
        if (!index->m_sym || !index->m_sym->IsIntConst())
        {
            return false;
        }

        // offset = indir.offset + (index << scale)
        int32 offset = index->m_sym->GetIntConstValue();
        if((indir->GetScale() != 0 && Int32Math::Shl(offset, indir->GetScale(), &offset)) ||
           (indir->GetOffset() != 0 && Int32Math::Add(indir->GetOffset(), offset, &offset)))
        {
            return false;
        }
        indir->SetOffset(offset);
        indir->SetIndexOpnd(nullptr);
    }

    IR::RegOpnd *base = indir->GetBaseOpnd();
    uint8 *constValue = nullptr;
    if (base)
    {
        if (!base->m_sym || !base->m_sym->IsConst() || base->m_sym->IsIntConst() || base->m_sym->IsFloatConst())
        {
            return false;
        }
        constValue = static_cast<uint8 *>(base->m_sym->GetConstAddress());
        if (indir->GetOffset() < 0 ? constValue + indir->GetOffset() > constValue : constValue + indir->GetOffset() < constValue)
        {
            return false;
        }
    }
    constValue += indir->GetOffset();

#ifdef _M_X64
    // Encoding only allows 32bits worth
    if(!Math::FitsInDWord((size_t)constValue))
    {
        Assert(base != nullptr);
        return false;
    }
#endif

    IR::MemRefOpnd *memref = IR::MemRefOpnd::New(constValue, indir->GetType(), instr->m_func);

    if (indir == instr->GetDst())
    {
        instr->ReplaceDst(memref);
    }
    else
    {
        instr->ReplaceSrc(indir, memref);
    }
    return true;
#endif
}